

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O3

void write_other_cert(scep *s)

{
  ulong uVar1;
  int iVar2;
  X509_NAME *pXVar3;
  char *pcVar4;
  ASN1_INTEGER *x;
  FILE *fp;
  BIO *bp;
  PKCS7 *pPVar5;
  X509 *a;
  X509_EXTENSION *pXVar6;
  ulong uVar7;
  FILE *pFVar8;
  ulong uVar9;
  undefined8 uVar10;
  X509 *unaff_RBX;
  char *unaff_RBP;
  char *pcVar11;
  char *unaff_R12;
  long lVar12;
  uint uVar13;
  ulong unaff_R13;
  ulong uVar14;
  char buffer [1024];
  uint uStack_ccc;
  PKCS7 *pPStack_cc8;
  BIO *pBStack_cc0;
  long lStack_cb8;
  byte abStack_cb0 [64];
  char acStack_c70 [1024];
  char acStack_870 [1032];
  X509 *pXStack_468;
  undefined1 *puStack_460;
  ulong uStack_458;
  FILE *pFStack_450;
  char **ppcStack_448;
  code *pcStack_440;
  char acStack_438 [1032];
  
  lVar12 = ((s->reply_p7->d).data)->flags;
  pcStack_440 = (code *)0x10dcb4;
  iVar2 = OPENSSL_sk_num(lVar12);
  if (0 < iVar2) {
    unaff_R13 = 0;
    do {
      pcStack_440 = (code *)0x10dccd;
      unaff_RBX = (X509 *)OPENSSL_sk_value(lVar12,unaff_R13);
      pcVar11 = pname;
      if (v_flag != 0) {
        pcStack_440 = (code *)0x10dcee;
        pXVar3 = X509_get_subject_name(unaff_RBX);
        pcStack_440 = (code *)0x10dcfe;
        pcVar4 = X509_NAME_oneline(pXVar3,acStack_438,0x400);
        pcStack_440 = (code *)0x10dd12;
        printf("%s: found certificate with\n  subject: %s\n",pcVar11,pcVar4);
        pcStack_440 = (code *)0x10dd1a;
        pXVar3 = X509_get_issuer_name(unaff_RBX);
        pcStack_440 = (code *)0x10dd2a;
        pcVar4 = X509_NAME_oneline(pXVar3,acStack_438,0x400);
        pcStack_440 = (code *)0x10dd3b;
        printf("  issuer: %s\n",pcVar4);
        unaff_RBP = pcVar11;
      }
      pcStack_440 = (code *)0x10dd43;
      x = X509_get_serialNumber(unaff_RBX);
      pcStack_440 = (code *)0x10dd56;
      iVar2 = ASN1_INTEGER_cmp(x,(ASN1_INTEGER *)s->ias_getcert->serial);
      unaff_R12 = acStack_438;
      if (iVar2 == 0) goto LAB_0010dd73;
      uVar13 = (int)unaff_R13 + 1;
      unaff_R13 = (ulong)uVar13;
      pcStack_440 = (code *)0x10dd65;
      iVar2 = OPENSSL_sk_num(lVar12);
      unaff_R12 = acStack_438;
    } while ((int)uVar13 < iVar2);
  }
  do {
    pcStack_440 = (code *)0x10dd73;
    write_other_cert_cold_3();
LAB_0010dd73:
  } while (unaff_RBX == (X509 *)0x0);
  pcStack_440 = (code *)0x10dd8e;
  pFVar8 = (FILE *)w_char;
  fp = fopen(w_char,"w");
  if (fp == (FILE *)0x0) {
    pcStack_440 = (code *)0x10de0a;
    write_other_cert_cold_2();
  }
  else {
    if (v_flag != 0) {
      pcStack_440 = (code *)0x10ddbd;
      printf("%s: certificate written as %s\n",pname,w_char);
    }
    if (d_flag != 0) {
      pcStack_440 = (code *)0x10dddb;
      PEM_write_X509(_stdout,unaff_RBX);
    }
    pcStack_440 = (code *)0x10dde6;
    pFVar8 = fp;
    iVar2 = PEM_write_X509(fp,unaff_RBX);
    s = (scep *)fp;
    if (iVar2 == 1) {
      pcStack_440 = (code *)0x10ddf3;
      fclose(fp);
      return;
    }
  }
  pcStack_440 = write_ca_ra;
  write_other_cert_cold_1();
  ppcStack_448 = &w_char;
  pXStack_468 = unaff_RBX;
  puStack_460 = unaff_R12;
  uStack_458 = unaff_R13;
  pFStack_450 = (FILE *)s;
  pcStack_440 = (code *)unaff_RBP;
  bp = BIO_new_mem_buf(pFVar8->_IO_read_end,*(int *)&pFVar8->_IO_read_base);
  pPVar5 = d2i_PKCS7_bio(bp,(PKCS7 **)0x0);
  if (pPVar5 == (PKCS7 *)0x0) {
    pcVar11 = "%s: error reading PKCS#7 data\n";
LAB_0010de5c:
    fprintf(_stderr,pcVar11,pname);
LAB_0010de66:
    ERR_print_errors_fp(_stderr);
  }
  else {
    iVar2 = OBJ_obj2nid(pPVar5->type);
    if (iVar2 == 0x16) {
      lVar12 = ((pPVar5->d).data)->flags;
      if (lVar12 != 0) {
        pPStack_cc8 = pPVar5;
        pBStack_cc0 = bp;
        iVar2 = OPENSSL_sk_num(lVar12);
        if (0 < iVar2) {
          uVar14 = 0;
          lStack_cb8 = lVar12;
          do {
            memset(acStack_870,0,0x400);
            memset(acStack_c70,0,0x400);
            a = (X509 *)OPENSSL_sk_value(lVar12,uVar14);
            snprintf(acStack_c70,0x400,"%s-%d",c_char,uVar14);
            pcVar11 = pname;
            if (v_flag != 0) {
              pXVar3 = X509_get_subject_name(a);
              pcVar4 = X509_NAME_oneline(pXVar3,acStack_870,0x400);
              printf("\n%s: found certificate with\n  subject: %s\n",pcVar11,pcVar4);
              if (v_flag != 0) {
                pXVar3 = X509_get_issuer_name(a);
                pcVar11 = X509_NAME_oneline(pXVar3,acStack_870,0x400);
                printf("  issuer: %s\n",pcVar11);
              }
            }
            iVar2 = X509_digest(a,(EVP_MD *)fp_alg,abStack_cb0,&uStack_ccc);
            if (iVar2 == 0) goto LAB_0010de66;
            iVar2 = X509_get_ext_by_NID(a,0x57,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  basic constraints: (not included)");
              }
            }
            else {
              pXVar6 = X509_get_ext(a,iVar2);
              if (v_flag != 0) {
                printf("  basic constraints: ");
                X509V3_EXT_print_fp(_stdout,pXVar6,0,0);
                putchar(10);
              }
            }
            iVar2 = X509_get_ext_by_NID(a,0x53,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  usage: (not included)");
                goto LAB_0010e0d7;
              }
            }
            else {
              pXVar6 = X509_get_ext(a,iVar2);
              if (v_flag != 0) {
                printf("  usage: ");
                X509V3_EXT_print_fp(_stdout,pXVar6,0,0);
                putchar(10);
LAB_0010e0d7:
                if (v_flag != 0) {
                  iVar2 = EVP_MD_get_type(fp_alg);
                  pcVar11 = OBJ_nid2sn(iVar2);
                  printf("  %s fingerprint: ",pcVar11);
                  uVar9 = (ulong)uStack_ccc;
                  if (0 < (int)uStack_ccc) {
                    uVar7 = 0;
                    do {
                      uVar1 = uVar7 + 1;
                      uVar10 = 10;
                      if (uVar1 != (uVar9 & 0xffffffff)) {
                        uVar10 = 0x3a;
                      }
                      printf("%02X%c",(ulong)abStack_cb0[uVar7],uVar10);
                      uVar9 = (ulong)(int)uStack_ccc;
                      uVar7 = uVar1;
                    } while ((long)uVar1 < (long)uVar9);
                  }
                }
              }
            }
            pFVar8 = fopen(acStack_c70,"w");
            if (pFVar8 == (FILE *)0x0) {
              pcVar11 = "%s: cannot open cert file for writing\n";
              goto LAB_0010dea6;
            }
            if (v_flag != 0) {
              printf("%s: certificate written as %s\n",pname,acStack_c70);
            }
            if (d_flag != 0) {
              PEM_write_X509(_stdout,a);
            }
            iVar2 = PEM_write_X509(pFVar8,a);
            if (iVar2 != 1) {
              pcVar11 = "%s: error while writing certificate file\n";
              goto LAB_0010de5c;
            }
            fclose(pFVar8);
            lVar12 = lStack_cb8;
            uVar13 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar13;
            iVar2 = OPENSSL_sk_num(lStack_cb8);
          } while ((int)uVar13 < iVar2);
        }
        PKCS7_free(pPStack_cc8);
        BIO_free(pBStack_cc0);
        exit(0);
      }
      pcVar11 = "%s: cannot find certificates\n";
LAB_0010dea6:
      fprintf(_stderr,pcVar11,pname);
    }
    else {
      printf("%s: wrong PKCS#7 type\n",pname);
    }
  }
  exit(0x5d);
}

Assistant:

void
write_other_cert(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509)		*certs;
	X509			*cert = NULL;
	FILE			*fp;
	int			i;
	X509 *othercert = NULL;

	/* Get certs */
	p7 = s->reply_p7;
	certs = p7->d.sign->cert;
	
	/* Find cert */
	for (i = 0; i < sk_X509_num(certs); i++) {
		char buffer[1024];

		cert = sk_X509_value(certs, i);
		if (v_flag) {
			printf("%s: found certificate with\n"
				"  subject: %s\n", pname,
				X509_NAME_oneline(X509_get_subject_name(cert),
					buffer, sizeof(buffer)));
			printf("  issuer: %s\n", 
				X509_NAME_oneline(X509_get_issuer_name(cert),
					buffer, sizeof(buffer)));
		}
		/* The serial has to match to requested one */
		if (!ASN1_INTEGER_cmp(X509_get_serialNumber(cert),
				s->ias_getcert->serial)) {
				othercert = cert;	
				break;
		}	
	}
	if (othercert == NULL) {
		fprintf(stderr, "%s: cannot find certificate\n", pname);
		exit (SCEP_PKISTATUS_FILE);

	}
	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, w_char, "w")))
#else
	if (!(fp = fopen(w_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open cert file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: certificate written as %s\n", pname, w_char);
	if (d_flag)
		PEM_write_X509(stdout, othercert);
	if (PEM_write_X509(fp, othercert) != 1) {
		fprintf(stderr, "%s: error while writing certificate "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	(void)fclose(fp);
}